

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O1

base_learner * recall_tree_setup(options_i *options,vw *all)

{
  uint32_t *location;
  size_t *location_00;
  size_t *location_01;
  vw_ostream *pvVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _func_int **pp_Var3;
  parser *ppVar4;
  double dVar5;
  int iVar6;
  uint uVar7;
  recall_tree *b;
  option_group_definition *poVar8;
  typed_option<float> *op;
  size_t sVar9;
  ostream *poVar10;
  size_t sVar11;
  base_learner *l;
  single_learner *base;
  learner<recall_tree_ns::recall_tree,_example> *plVar12;
  long lVar13;
  undefined **ppuVar14;
  label_parser *plVar15;
  char *__s;
  byte bVar16;
  size_type __dnew_6;
  size_type __dnew_5;
  option_group_definition new_options;
  size_type __dnew_4;
  size_type __dnew_3;
  size_type __dnew_2;
  size_type __dnew;
  size_type __dnew_1;
  long local_5d0;
  long *local_5c8;
  long local_5c0;
  long local_5b8 [2];
  string local_5a8;
  _func_int ***local_588;
  _func_int **local_580;
  _func_int **local_578 [2];
  _func_int ***local_568;
  _func_int **local_560;
  _func_int **local_558 [2];
  _func_int ***local_548;
  _func_int **local_540;
  _func_int **local_538 [2];
  _func_int ***local_528;
  _func_int **local_520;
  _func_int **local_518 [2];
  _func_int ***local_508;
  _func_int **local_500;
  _func_int **local_4f8 [2];
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  option_group_definition local_448;
  undefined7 *local_410;
  undefined8 local_408;
  undefined7 local_400;
  undefined4 uStack_3f9;
  undefined1 local_3f5;
  undefined1 local_3f0 [112];
  bool local_380;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_358;
  undefined1 local_350 [112];
  bool local_2e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  undefined1 local_2b0 [112];
  bool local_240;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  undefined1 local_210 [112];
  bool local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  undefined1 local_170 [112];
  bool local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  typed_option<float> local_d0;
  
  bVar16 = 0;
  b = calloc_or_throw<recall_tree_ns::recall_tree>(1);
  b->all = (vw *)0x0;
  b->k = 0;
  b->node_only = false;
  *(undefined3 *)&b->field_0xd = 0;
  (b->nodes)._begin = (node *)0x0;
  (b->nodes)._end = (node *)0x0;
  (b->nodes).end_array = (node *)0x0;
  (b->nodes).erase_count = 0;
  b->max_candidates = 0;
  b->max_routers = 0;
  b->max_depth = 0;
  b->bern_hyper = 0.0;
  b->randomized_routing = false;
  *(undefined3 *)&b->field_0x4d = 0;
  local_400 = 0x206c6c61636552;
  uStack_3f9 = 0x65657254;
  local_408 = 0xb;
  local_3f5 = 0;
  paVar2 = &local_448.m_name.field_2;
  local_448.m_name._M_dataplus._M_p = (pointer)paVar2;
  local_410 = &local_400;
  std::__cxx11::string::_M_construct<char*>((string *)&local_448,&local_400);
  local_448.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_410 != &local_400) {
    operator_delete(local_410);
  }
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  local_468.field_2._M_allocated_capacity._0_7_ = 0x5f6c6c61636572;
  local_468.field_2._7_4_ = 0x65657274;
  local_468._M_string_length = 0xb;
  local_468.field_2._M_local_buf[0xb] = '\0';
  location = &b->k;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_3f0,&local_468,location);
  local_380 = true;
  local_508 = local_4f8;
  local_170._0_8_ = (_func_int **)0x1e;
  local_508 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_508,(ulong)local_170);
  local_4f8[0] = (_func_int **)local_170._0_8_;
  builtin_strncpy((char *)((long)local_508 + 0xe),"e for mu",8);
  builtin_strncpy((char *)((long)local_508 + 0x16),"lticlass",8);
  *local_508 = (_func_int **)0x696c6e6f20657355;
  local_508[1] = (_func_int **)0x206565727420656e;
  local_500 = (_func_int **)local_170._0_8_;
  *(char *)((long)local_508 + local_170._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  poVar8 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (&local_448,(typed_option<unsigned_int> *)local_3f0);
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  local_488.field_2._M_allocated_capacity._0_6_ = 0x61635f78616d;
  local_488.field_2._M_allocated_capacity._6_2_ = 0x646e;
  local_488.field_2._8_6_ = 0x736574616469;
  local_488._M_string_length = 0xe;
  local_488.field_2._M_local_buf[0xe] = '\0';
  location_00 = &b->max_candidates;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_170,&local_488,location_00);
  local_100 = true;
  local_528 = local_518;
  local_d0.super_base_option._vptr_base_option = (_func_int **)0x2d;
  local_528 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_528,(ulong)&local_d0);
  local_518[0] = local_d0.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_528 + 0x1d),"leaf in ",8);
  builtin_strncpy((char *)((long)local_528 + 0x25),"the tree",8);
  local_528[2] = (_func_int **)0x736c6562616c2066;
  local_528[3] = (_func_int **)0x61656c2072657020;
  *local_528 = (_func_int **)0x206d756d6978616d;
  local_528[1] = (_func_int **)0x6f207265626d756e;
  local_520 = local_d0.super_base_option._vptr_base_option;
  *(char *)((long)local_528 + (long)local_d0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  poVar8 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar8,(typed_option<unsigned_long> *)local_170);
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  local_4a8.field_2._M_allocated_capacity = 0x7079685f6e726562;
  local_4a8.field_2._8_2_ = 0x7265;
  local_4a8._M_string_length = 10;
  local_4a8.field_2._M_local_buf[10] = '\0';
  VW::config::typed_option<float>::typed_option(&local_d0,&local_4a8,&b->bern_hyper);
  op = VW::config::typed_option<float>::default_value(&local_d0,1.0);
  local_548 = local_538;
  local_210._0_8_ = (_func_int **)0x19;
  local_548 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_548,(ulong)local_210);
  local_538[0] = (_func_int **)local_210._0_8_;
  builtin_strncpy((char *)((long)local_548 + 9),"ee depth",8);
  builtin_strncpy((char *)((long)local_548 + 0x11)," penalty",8);
  *local_548 = (_func_int **)0x74206c6c61636572;
  local_548[1] = (_func_int **)0x7470656420656572;
  local_540 = (_func_int **)local_210._0_8_;
  *(char *)((long)local_548 + local_210._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar8 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar8,op);
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  local_4c8.field_2._M_allocated_capacity = 0x747065645f78616d;
  local_4c8.field_2._8_2_ = 0x68;
  local_4c8._M_string_length = 9;
  location_01 = &b->max_depth;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_210,&local_4c8,location_01);
  local_1a0 = true;
  local_568 = local_558;
  local_2b0._0_8_ = (_func_int **)0x33;
  local_568 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_568,(ulong)local_2b0);
  local_558[0] = (_func_int **)local_2b0._0_8_;
  local_568[4] = (_func_int **)0x325f676f6c20746c;
  local_568[5] = (_func_int **)0x7373616c63232820;
  local_568[2] = (_func_int **)0x6572742065687420;
  local_568[3] = (_func_int **)0x7561666564202c65;
  *local_568 = (_func_int **)0x206d756d6978616d;
  local_568[1] = (_func_int **)0x666f206874706564;
  builtin_strncpy((char *)((long)local_568 + 0x2f),"ses)",4);
  local_560 = (_func_int **)local_2b0._0_8_;
  *(char *)((long)local_568 + local_2b0._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_210 + 0x30));
  poVar8 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar8,(typed_option<unsigned_long> *)local_210);
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  local_4e8.field_2._M_allocated_capacity = 0x6c6e6f5f65646f6e;
  local_4e8.field_2._8_2_ = 0x79;
  local_4e8._M_string_length = 9;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2b0,&local_4e8,&b->node_only);
  local_240 = true;
  local_588 = local_578;
  local_350._0_8_ = (_func_int **)0x2e;
  local_588 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_588,(ulong)local_350);
  local_578[0] = (_func_int **)local_350._0_8_;
  builtin_strncpy((char *)((long)local_588 + 0x1e),"ll path ",8);
  builtin_strncpy((char *)((long)local_588 + 0x26),"features",8);
  local_588[2] = (_func_int **)0x202c736572757461;
  local_588[3] = (_func_int **)0x6c6c756620746f6e;
  *local_588 = (_func_int **)0x65737520796c6e6f;
  local_588[1] = (_func_int **)0x65662065646f6e20;
  local_580 = (_func_int **)local_350._0_8_;
  *(char *)((long)local_588 + local_350._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_2b0 + 0x30));
  poVar8 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar8,(typed_option<bool> *)local_2b0);
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  local_5c8 = (long *)0x12;
  local_5a8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_5a8,(ulong)&local_5c8);
  local_5a8.field_2._M_allocated_capacity = (size_type)local_5c8;
  builtin_strncpy(local_5a8._M_dataplus._M_p,"randomized_routing",0x12);
  local_5a8._M_string_length = (size_type)local_5c8;
  local_5a8._M_dataplus._M_p[(long)local_5c8] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_350,&local_5a8,&b->randomized_routing);
  local_2e0 = true;
  local_5d0 = 0x12;
  local_5c8 = local_5b8;
  local_5c8 = (long *)std::__cxx11::string::_M_create((ulong *)&local_5c8,(ulong)&local_5d0);
  local_5b8[0] = local_5d0;
  *local_5c8 = 0x7a696d6f646e6172;
  local_5c8[1] = 0x6974756f72206465;
  *(undefined2 *)(local_5c8 + 2) = 0x676e;
  local_5c0 = local_5d0;
  *(char *)((long)local_5c8 + local_5d0) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar8,(typed_option<bool> *)local_350);
  if (local_5c8 != local_5b8) {
    operator_delete(local_5c8);
  }
  local_350._0_8_ = &PTR__typed_option_002d4fb0;
  if (local_2b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8._M_pi);
  }
  if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p);
  }
  if (local_588 != local_578) {
    operator_delete(local_588);
  }
  local_2b0._0_8_ = &PTR__typed_option_002d4fb0;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
  }
  if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p);
  }
  if (local_568 != local_558) {
    operator_delete(local_568);
  }
  local_210._0_8_ = &PTR__typed_option_002d5088;
  if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
  }
  if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p);
  }
  if (local_548 != local_538) {
    operator_delete(local_548);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d50c0;
  if (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p);
  }
  if (local_528 != local_518) {
    operator_delete(local_528);
  }
  local_170._0_8_ = &PTR__typed_option_002d5088;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p);
  }
  if (local_508 != local_4f8) {
    operator_delete(local_508);
  }
  local_3f0._0_8_ = &PTR__typed_option_002d50f8;
  if (local_358._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358._M_pi);
  }
  if (local_368._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_448);
  pp_Var3 = (_func_int **)(local_3f0 + 0x10);
  local_3f0._16_6_ = 0x6c6c61636572;
  local_3f0[0x16] = 0x5f;
  local_3f0[0x17] = 0x74;
  local_3f0._24_2_ = 0x6572;
  local_3f0[0x1a] = 'e';
  local_3f0._8_8_ = (pointer)0xb;
  local_3f0[0x1b] = '\0';
  local_3f0._0_8_ = pp_Var3;
  iVar6 = (*options->_vptr_options_i[1])(options,local_3f0);
  if ((_func_int **)local_3f0._0_8_ != pp_Var3) {
    operator_delete((void *)local_3f0._0_8_);
  }
  if ((char)iVar6 == '\0') {
    plVar12 = (learner<recall_tree_ns::recall_tree,_example> *)0x0;
  }
  else {
    b->all = all;
    local_3f0._16_6_ = 0x61635f78616d;
    local_3f0[0x16] = 0x6e;
    local_3f0[0x17] = 100;
    local_3f0._24_2_ = 0x6469;
    local_3f0[0x1a] = 'a';
    local_3f0[0x1b] = 't';
    local_3f0._28_2_ = 0x7365;
    local_3f0._8_8_ = (pointer)0xe;
    local_3f0[0x1e] = '\0';
    local_3f0._0_8_ = pp_Var3;
    iVar6 = (*options->_vptr_options_i[1])(options);
    if ((char)iVar6 == '\0') {
      dVar5 = log((double)*location);
      dVar5 = ceil(dVar5 / 0.6931471805599453);
      uVar7 = (int)(long)dVar5 << 2;
      if (*location <= uVar7) {
        uVar7 = *location;
      }
      sVar9 = (size_t)uVar7;
    }
    else {
      sVar9 = *location_00;
    }
    *location_00 = sVar9;
    if ((_func_int **)local_3f0._0_8_ != pp_Var3) {
      operator_delete((void *)local_3f0._0_8_);
    }
    local_3f0._16_6_ = 0x65645f78616d;
    local_3f0[0x16] = 0x70;
    local_3f0[0x17] = 0x74;
    local_3f0._24_2_ = 0x68;
    local_3f0._8_8_ = (pointer)0x9;
    local_3f0._0_8_ = pp_Var3;
    iVar6 = (*options->_vptr_options_i[1])(options);
    if ((char)iVar6 == '\0') {
      dVar5 = log((double)*location);
      dVar5 = ceil(dVar5 / 0.6931471805599453);
      sVar9 = (long)dVar5 & 0xffffffff;
    }
    else {
      sVar9 = *location_01;
    }
    *location_01 = sVar9;
    if ((_func_int **)local_3f0._0_8_ != pp_Var3) {
      operator_delete((void *)local_3f0._0_8_);
    }
    recall_tree_ns::init_tree(b);
    if (all->quiet == false) {
      pvVar1 = &all->trace_message;
      std::__ostream_insert<char,std::char_traits<char>>(&pvVar1->super_ostream,"recall_tree:",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(&pvVar1->super_ostream," node_only = ",0xd)
      ;
      poVar10 = std::ostream::_M_insert<bool>(SUB81(pvVar1,0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," bern_hyper = ",0xe);
      poVar10 = std::ostream::_M_insert<double>((double)b->bern_hyper);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," max_depth = ",0xd);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," routing = ",0xb);
      if (all->training == true) {
        __s = "deterministic";
        if (b->randomized_routing != false) {
          __s = "randomized";
        }
      }
      else {
        __s = "n/a testonly";
      }
      sVar11 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,__s,sVar11);
      std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
    }
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    ppVar4 = all->p;
    plVar12 = LEARNER::learner<recall_tree_ns::recall_tree,example>::
              init_learner<LEARNER::learner<char,example>>
                        (b,base,recall_tree_ns::learn,recall_tree_ns::predict,
                         (ulong)b->k + b->max_routers,multiclass);
    *(undefined8 *)(plVar12 + 0x58) = *(undefined8 *)(plVar12 + 0x18);
    *(code **)(plVar12 + 0x68) = MULTICLASS::finish_example<recall_tree_ns::recall_tree>;
    ppuVar14 = &MULTICLASS::mc_label;
    plVar15 = &ppVar4->lp;
    for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
      plVar15->default_label = (_func_void_void_ptr *)*ppuVar14;
      ppuVar14 = ppuVar14 + (ulong)bVar16 * -2 + 1;
      plVar15 = (label_parser *)((long)plVar15 + (ulong)bVar16 * -0x10 + 8);
    }
    *(code **)(plVar12 + 0x80) = recall_tree_ns::save_load_tree;
    *(undefined8 *)(plVar12 + 0x70) = *(undefined8 *)(plVar12 + 0x18);
    *(undefined8 *)(plVar12 + 0x78) = *(undefined8 *)(plVar12 + 0x20);
    *(undefined8 *)(plVar12 + 0xb8) = *(undefined8 *)(plVar12 + 0x18);
    *(undefined8 *)(plVar12 + 0xc0) = *(undefined8 *)(plVar12 + 0x20);
    *(code **)(plVar12 + 200) = recall_tree_ns::finish;
    b = (recall_tree *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_448.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_448.m_name._M_dataplus._M_p);
  }
  if (b != (recall_tree *)0x0) {
    free(b);
  }
  return (base_learner *)plVar12;
}

Assistant:

base_learner* recall_tree_setup(options_i& options, vw& all)
{
  auto tree = scoped_calloc_or_throw<recall_tree>();
  option_group_definition new_options("Recall Tree");
  new_options.add(make_option("recall_tree", tree->k).keep().help("Use online tree for multiclass"))
      .add(make_option("max_candidates", tree->max_candidates)
               .keep()
               .help("maximum number of labels per leaf in the tree"))
      .add(make_option("bern_hyper", tree->bern_hyper).default_value(1.f).help("recall tree depth penalty"))
      .add(make_option("max_depth", tree->max_depth).keep().help("maximum depth of the tree, default log_2 (#classes)"))
      .add(make_option("node_only", tree->node_only).keep().help("only use node features, not full path features"))
      .add(make_option("randomized_routing", tree->randomized_routing).keep().help("randomized routing"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("recall_tree"))
    return nullptr;

  tree->all = &all;
  tree->max_candidates = options.was_supplied("max_candidates")
      ? tree->max_candidates
      : (std::min)(tree->k, 4 * (uint32_t)(ceil(log(tree->k) / log(2.0))));
  tree->max_depth =
      options.was_supplied("max_depth") ? tree->max_depth : (uint32_t)std::ceil(std::log(tree->k) / std::log(2.0));

  init_tree(*tree.get());

  if (!all.quiet)
    all.trace_message << "recall_tree:"
                      << " node_only = " << tree->node_only << " bern_hyper = " << tree->bern_hyper
                      << " max_depth = " << tree->max_depth << " routing = "
                      << (all.training ? (tree->randomized_routing ? "randomized" : "deterministic") : "n/a testonly")
                      << std::endl;

  learner<recall_tree, example>& l = init_multiclass_learner(
      tree, as_singleline(setup_base(options, all)), learn, predict, all.p, tree->max_routers + tree->k);
  l.set_save_load(save_load_tree);
  l.set_finish(finish);

  return make_base(l);
}